

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O3

vector<AEntity_*,_std::allocator<AEntity_*>_> * __thiscall
Api::getCurrentHand(Api *this,bool verbose)

{
  int iVar1;
  Player *pPVar2;
  vector<AEntity_*,_std::allocator<AEntity_*>_> *pvVar3;
  ostream *poVar4;
  ACard *this_00;
  undefined7 in_register_00000031;
  ulong uVar5;
  string local_50;
  
  pPVar2 = GameManager::get_player(&this->_game);
  iVar1 = GameManager::get_playerTurn(&this->_game);
  pvVar3 = Player::get_hands(pPVar2 + iVar1);
  if ((int)CONCAT71(in_register_00000031,verbose) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Hand current player :",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    if ((pvVar3->super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (pvVar3->super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      uVar5 = 0;
      do {
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
        this_00 = AEntity::get_reference
                            ((pvVar3->super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar5]);
        ACard::get_name_abi_cxx11_(&local_50,this_00);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)((long)(pvVar3->
                                     super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>).
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(pvVar3->
                                     super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>).
                                     _M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  return pvVar3;
}

Assistant:

const std::vector<AEntity *> &Api::getCurrentHand(bool verbose) {
    if (verbose){
        const std::vector<AEntity *> &hand = this->_game.get_player()[this->_game.get_playerTurn()].get_hands();
        std::cout << "Hand current player :" << std::endl;
        for (int i = 0; i < hand.size(); i += 1) {
            std::cout << i << ": " << hand[i]->get_reference()->get_name() << std::endl;
        }
        return hand;
    } else {
        return this->_game.get_player()[this->_game.get_playerTurn()].get_hands();
    }
}